

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ErrorExpected
          (WastParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *expected,char *example)

{
  Location loc;
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 in_R9;
  string local_d0;
  undefined8 local_b0;
  char *local_a8;
  size_type local_a0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_98;
  ulong local_90;
  size_t i;
  string expected_str;
  Token token;
  char *example_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *expected_local;
  WastParser *this_local;
  
  Consume((Token *)((long)&expected_str.field_2 + 8),this);
  std::__cxx11::string::string((string *)&i);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(expected);
  if (!bVar3) {
    std::__cxx11::string::operator=((string *)&i,", expected ");
    for (local_90 = 0; uVar1 = local_90,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(expected), uVar2 = local_90, uVar1 < sVar4; local_90 = local_90 + 1) {
      if (local_90 != 0) {
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(expected);
        if (uVar2 == sVar4 - 1) {
          std::__cxx11::string::operator+=((string *)&i," or ");
        }
        else {
          std::__cxx11::string::operator+=((string *)&i,", ");
        }
      }
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](expected,local_90);
      std::__cxx11::string::operator+=((string *)&i,(string *)pvVar5);
    }
    if (example != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)&i," (e.g. ");
      std::__cxx11::string::operator+=((string *)&i,example);
      std::__cxx11::string::operator+=((string *)&i,")");
    }
  }
  local_b0 = expected_str.field_2._8_8_;
  local_a8 = token.loc.filename.data_;
  local_a0 = token.loc.filename.size_;
  local_98.offset = (size_t)token.loc.field_1.field_1.offset;
  Token::to_string_clamp_abi_cxx11_(&local_d0,(Token *)((long)&expected_str.field_2 + 8),0x50);
  uVar6 = std::__cxx11::string::c_str();
  uVar7 = std::__cxx11::string::c_str();
  loc.filename.size_ = (size_type)local_a8;
  loc.filename.data_ = (char *)local_b0;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_a0;
  loc.field_1._8_8_ = local_98.offset;
  Error(this,loc,"unexpected token \"%s\"%s.",uVar6,uVar7,local_a0,in_R9);
  std::__cxx11::string::~string((string *)&local_d0);
  Result::Result((Result *)((long)&this_local + 4),Error);
  std::__cxx11::string::~string((string *)&i);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ErrorExpected(const std::vector<std::string>& expected,
                                 const char* example) {
  Token token = Consume();
  std::string expected_str;
  if (!expected.empty()) {
    expected_str = ", expected ";
    for (size_t i = 0; i < expected.size(); ++i) {
      if (i != 0) {
        if (i == expected.size() - 1) {
          expected_str += " or ";
        } else {
          expected_str += ", ";
        }
      }

      expected_str += expected[i];
    }

    if (example) {
      expected_str += " (e.g. ";
      expected_str += example;
      expected_str += ")";
    }
  }

  Error(token.loc, "unexpected token \"%s\"%s.",
        token.to_string_clamp(kMaxErrorTokenLength).c_str(),
        expected_str.c_str());
  return Result::Error;
}